

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  ushort uVar1;
  ushort uVar2;
  size_t sVar3;
  PrimRef *pPVar4;
  undefined1 auVar5 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  uint uVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t index;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  long lVar24;
  undefined4 uVar25;
  bool bVar26;
  bool bVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  size_t local_98;
  size_t local_90;
  uint local_40;
  undefined1 auVar29 [64];
  undefined1 auVar31 [64];
  
  aVar28.m128[2] = INFINITY;
  aVar28._0_8_ = 0x7f8000007f800000;
  aVar28.m128[3] = INFINITY;
  auVar29 = ZEXT1664((undefined1  [16])aVar28);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar28;
  aVar30.m128[2] = -INFINITY;
  aVar30._0_8_ = 0xff800000ff800000;
  aVar30.m128[3] = -INFINITY;
  auVar31 = ZEXT1664((undefined1  [16])aVar30);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar28;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar30;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  local_98 = __return_storage_ptr__->end;
  aVar34 = aVar28;
  aVar32 = aVar30;
  if (uVar14 < r->_end) {
    auVar36._8_4_ = 0xddccb9a2;
    auVar36._0_8_ = 0xddccb9a2ddccb9a2;
    auVar36._12_4_ = 0xddccb9a2;
    auVar37._8_4_ = 0x5dccb9a2;
    auVar37._0_8_ = 0x5dccb9a25dccb9a2;
    auVar37._12_4_ = 0x5dccb9a2;
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    auVar39._8_4_ = 0x7f800000;
    auVar39._0_8_ = 0x7f8000007f800000;
    auVar39._12_4_ = 0x7f800000;
    auVar35 = ZEXT1664((undefined1  [16])aVar28);
    auVar33 = ZEXT1664((undefined1  [16])aVar30);
    local_90 = k;
    do {
      if (uVar14 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar24 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar19 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar18 = *(long *)&(this->super_GridMesh).field_0x68 * uVar14;
        uVar11 = *(uint *)(lVar24 + lVar18);
        if (uVar11 < uVar19) {
          uVar1 = *(ushort *)(lVar24 + 10 + lVar18);
          uVar12 = (ulong)uVar1;
          uVar8 = *(uint *)(lVar24 + 4 + lVar18);
          uVar2 = *(ushort *)(lVar24 + 8 + lVar18);
          if (((uint)uVar2 + uVar8 * (uVar1 - 1) + uVar11) - 1 < uVar19) {
            bVar27 = uVar12 != 0;
            if (bVar27) {
              pBVar9 = (this->super_GridMesh).vertices.items;
              uVar19 = 0;
              do {
                if (uVar2 != 0) {
                  uVar21 = 0;
                  do {
                    bVar26 = true;
                    lVar24 = 0;
                    while (bVar26) {
                      auVar41 = *(undefined1 (*) [16])
                                 (pBVar9[lVar24].super_RawBufferView.ptr_ofs +
                                 pBVar9[lVar24].super_RawBufferView.stride *
                                 (uVar19 * uVar8 + (ulong)uVar11 + uVar21));
                      auVar43 = vcmpps_avx(auVar41,auVar36,6);
                      auVar41 = vcmpps_avx(auVar41,auVar37,1);
                      auVar41 = vandps_avx(auVar43,auVar41);
                      uVar25 = vmovmskps_avx(auVar41);
                      lVar24 = 1;
                      bVar26 = false;
                      if ((~(byte)uVar25 & 7) != 0) {
                        if (bVar27) goto LAB_01327f87;
                        goto LAB_01327d22;
                      }
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar2);
                }
                uVar19 = uVar19 + 1;
                bVar27 = uVar19 < uVar12;
              } while (uVar19 != uVar12);
            }
LAB_01327d22:
            lVar24 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
            lVar18 = *(long *)&(this->super_GridMesh).field_0x68 * uVar14;
            if (*(short *)(lVar24 + 10 + lVar18) != 1) {
              uVar11 = 0;
              do {
                uVar1 = *(ushort *)(lVar24 + 8 + lVar18);
                uVar8 = (uint)uVar1;
                if (uVar1 != 1) {
                  uVar19 = (ulong)uVar11;
                  uVar10 = 0;
                  do {
                    uVar21 = (ulong)uVar10;
                    uVar12 = (ulong)(this->super_GridMesh).super_Geometry.numTimeSteps;
                    bVar27 = uVar12 != 0;
                    auVar41 = auVar39;
                    auVar43 = auVar38;
                    if (bVar27) {
                      uVar1 = *(ushort *)(lVar24 + 10 + lVar18);
                      uVar17 = (ulong)uVar1;
                      uVar13 = uVar17;
                      if (uVar19 + 3 < uVar17) {
                        uVar13 = uVar19 + 3;
                      }
                      uVar15 = uVar21 + 3;
                      if ((ulong)uVar8 <= uVar21 + 3) {
                        uVar15 = (ulong)uVar8;
                      }
                      uVar16 = 0;
                      auVar40 = ZEXT1664(auVar38);
                      auVar42 = ZEXT1664(auVar39);
                      do {
                        local_40 = (uint)uVar1;
                        if (uVar11 < local_40) {
                          pBVar9 = (this->super_GridMesh).vertices.items + uVar16;
                          uVar22 = uVar19;
                          bVar26 = uVar19 < uVar17;
                          do {
                            if (uVar10 < uVar8) {
                              sVar3 = (pBVar9->super_RawBufferView).stride;
                              pauVar23 = (undefined1 (*) [16])
                                         ((pBVar9->super_RawBufferView).ptr_ofs +
                                         (*(uint *)(lVar24 + lVar18) + uVar21 +
                                         *(uint *)(lVar24 + 4 + lVar18) * uVar22) * sVar3);
                              uVar20 = uVar21;
                              do {
                                auVar41 = *pauVar23;
                                auVar43 = vcmpps_avx(auVar41,auVar36,6);
                                auVar5 = vcmpps_avx(auVar41,auVar37,1);
                                auVar43 = vandps_avx(auVar43,auVar5);
                                uVar25 = vmovmskps_avx(auVar43);
                                if ((~(byte)uVar25 & 7) != 0) {
                                  if (!bVar26) goto LAB_01327e63;
                                  auVar41 = auVar42._0_16_;
                                  auVar43 = auVar40._0_16_;
                                  if (bVar27) {
                                    auVar41 = auVar39;
                                    auVar43 = auVar38;
                                  }
                                  goto LAB_01327ea1;
                                }
                                auVar43 = vminps_avx(auVar42._0_16_,auVar41);
                                auVar42 = ZEXT1664(auVar43);
                                auVar41 = vmaxps_avx(auVar40._0_16_,auVar41);
                                auVar40 = ZEXT1664(auVar41);
                                uVar20 = uVar20 + 1;
                                pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar3);
                              } while (uVar20 < uVar15);
                            }
                            uVar22 = uVar22 + 1;
                            bVar26 = uVar22 < uVar13;
                          } while (bVar26);
                        }
LAB_01327e63:
                        auVar43 = auVar40._0_16_;
                        auVar41 = auVar42._0_16_;
                        uVar16 = uVar16 + 1;
                        bVar27 = uVar16 < uVar12;
                      } while (uVar16 != uVar12);
                    }
LAB_01327ea1:
                    if (!bVar27) {
                      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              )vinsertps_avx(auVar41,ZEXT416(geomID),0x30);
                      aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              )vinsertps_avx(auVar43,ZEXT416((uint)local_90),0x30);
                      auVar41 = vminps_avx(auVar29._0_16_,(undefined1  [16])aVar6);
                      auVar29 = ZEXT1664(auVar41);
                      auVar41 = vmaxps_avx(auVar31._0_16_,(undefined1  [16])aVar7);
                      auVar31 = ZEXT1664(auVar41);
                      auVar43._0_4_ = aVar6.x + aVar7.x;
                      auVar43._4_4_ = aVar6.y + aVar7.y;
                      auVar43._8_4_ = aVar6.z + aVar7.z;
                      auVar43._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
                      auVar41 = vminps_avx(auVar35._0_16_,auVar43);
                      auVar35 = ZEXT1664(auVar41);
                      auVar41 = vmaxps_avx(auVar33._0_16_,auVar43);
                      auVar33 = ZEXT1664(auVar41);
                      local_98 = local_98 + 1;
                      sgrids->items[local_90] =
                           (SubGridBuildData)
                           ((ulong)(uVar10 & 0xfffe | (uint)(uVar8 <= uVar10 + 2) << 0xf) |
                            uVar14 << 0x20 |
                           (ulong)(uVar11 << 0x10 |
                                  (uint)((uint)*(ushort *)(lVar24 + 10 + lVar18) <= uVar11 + 2) <<
                                  0x1f));
                      pPVar4 = prims->items;
                      pPVar4[local_90].upper.field_0.field_1 = aVar7;
                      pPVar4[local_90].lower.field_0.field_1 = aVar6;
                      local_90 = local_90 + 1;
                    }
                    uVar10 = uVar10 + 2;
                    uVar8 = (uint)*(ushort *)(lVar24 + 8 + lVar18);
                  } while (uVar10 < uVar8 - 1);
                }
                uVar11 = uVar11 + 2;
              } while (uVar11 < *(ushort *)(lVar24 + 10 + lVar18) - 1);
            }
          }
        }
      }
LAB_01327f87:
      aVar32 = auVar33._0_16_;
      aVar34 = auVar35._0_16_;
      aVar30 = auVar31._0_16_;
      aVar28 = auVar29._0_16_;
      uVar14 = uVar14 + 1;
    } while (uVar14 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar28;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar30;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar32;
  __return_storage_ptr__->end = local_98;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }